

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

Error asmjit::Logging::formatOperand
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                Operand_ *op)

{
  Error EVar1;
  Operand_ *in_stack_00000068;
  uint32_t in_stack_00000074;
  CodeEmitter *in_stack_00000078;
  uint32_t in_stack_00000084;
  StringBuilder *in_stack_00000088;
  
  EVar1 = X86Logging::formatOperand
                    (in_stack_00000088,in_stack_00000084,in_stack_00000078,in_stack_00000074,
                     in_stack_00000068);
  return EVar1;
}

Assistant:

Error Logging::formatOperand(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  const Operand_& op) noexcept {

#if defined(ASMJIT_BUILD_X86)
  return X86Logging::formatOperand(sb, logOptions, emitter, archType, op);
#endif // ASMJIT_BUILD_X86

#if defined(ASMJIT_BUILD_ARM)
  return ArmLogging::formatOperand(sb, logOptions, emitter, archType, op);
#endif // ASMJIT_BUILD_ARM

  return kErrorInvalidArch;
}